

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

void __thiscall script_tests::script_json_test::test_method(script_json_test *this)

{
  pointer pcVar1;
  string strFlags;
  check_type cVar10;
  int iVar2;
  UniValue *pUVar3;
  UniValue *pUVar4;
  string *psVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  size_t index;
  iterator in_R8;
  string *in_R9;
  size_t index_00;
  long in_FS_OFFSET;
  bool bVar9;
  string_view jsondata;
  string_view hex_str;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  CScriptWitness witness;
  CScript scriptPubKey;
  string scriptPubKeyString;
  CScript scriptSig;
  string scriptSigString;
  string strTest;
  UniValue tests;
  uint in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  check_type cVar11;
  undefined8 in_stack_fffffffffffffd98;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  CScriptWitness local_218;
  char *local_1f8;
  char *local_1f0;
  assertion_result local_1e8;
  char *local_1d0;
  undefined **local_1c8;
  undefined1 local_1c0;
  undefined ***local_1b8;
  string *local_1b0;
  lazy_ostream local_1a8;
  undefined ***local_198;
  char *local_190;
  assertion_result local_188;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  long *local_150 [2];
  long local_140 [2];
  direct_or_indirect local_130;
  uint local_114;
  string local_110;
  direct_or_indirect local_f0;
  uint local_d4;
  string local_d0;
  undefined1 local_b0 [32];
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str = json_tests::detail_script_tests_bytes;
  jsondata._M_len = 0x34a49;
  read_json(&local_90,jsondata);
  if (local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index_00 = 0;
    do {
      pUVar3 = ::UniValue::operator[](&local_90,index_00);
      ::UniValue::write_abi_cxx11_((UniValue *)local_b0,(int)pUVar3,(void *)0x0,0);
      local_218.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_218.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (((pUVar3->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (pUVar3->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start) ||
         (pUVar4 = ::UniValue::operator[](pUVar3,0), pUVar4->typ != VARR)) {
        _cVar10 = CHECK_PRED;
        index = 0;
      }
      else {
        uVar8 = 0;
        while( true ) {
          pUVar4 = ::UniValue::operator[](pUVar3,0);
          uVar7 = (ulong)uVar8;
          if (((long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - 1U <=
              uVar7) break;
          pUVar4 = ::UniValue::operator[](pUVar3,0);
          pUVar4 = ::UniValue::operator[](pUVar4,uVar7);
          psVar5 = ::UniValue::get_str_abi_cxx11_(pUVar4);
          hex_str._M_str = (psVar5->_M_dataplus)._M_p;
          hex_str._M_len = psVar5->_M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,hex_str);
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)&local_218,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8);
          if (local_1a8._vptr_lazy_ostream != (_func_int **)0x0) {
            operator_delete(local_1a8._vptr_lazy_ostream,
                            (long)local_198 - (long)local_1a8._vptr_lazy_ostream);
          }
          uVar8 = uVar8 + 1;
        }
        pUVar4 = ::UniValue::operator[](pUVar3,0);
        pUVar4 = ::UniValue::operator[](pUVar4,uVar7);
        _cVar10 = (check_type)AmountFromValue(pUVar4,8);
        index = 1;
      }
      lVar6 = (long)(pUVar3->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(pUVar3->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_start;
      iVar2 = (int)index;
      if ((ulong)((lVar6 >> 3) * 0x2e8ba2e8ba2e8ba3) < (ulong)(iVar2 + 4)) {
        if (lVar6 != 0x58) {
          local_228 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_220 = "";
          local_238 = &boost::unit_test::basic_cstring<char_const>::null;
          local_230 = &boost::unit_test::basic_cstring<char_const>::null;
          file.m_end = (iterator)0x3a9;
          file.m_begin = (iterator)&local_228;
          msg.m_end = (iterator)in_R9;
          msg.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_238,
                     msg);
          local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
          local_1e8.m_message.px = (element_type *)0x0;
          local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_1c0 = 0;
          local_1c8 = &PTR__lazy_ostream_013ab680;
          local_1b8 = (undefined ***)boost::unit_test::lazy_ostream::inst;
          local_1b0 = (string *)0xe5be19;
          local_1a8.m_empty = false;
          local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ab6c0;
          local_198 = &local_1c8;
          local_190 = local_b0;
          local_248 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_240 = "";
          in_stack_fffffffffffffd88 = 0;
          in_stack_fffffffffffffd8c = 0;
          in_R8 = (iterator)0x1;
          in_R9 = (string *)0x1;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1e8,&local_1a8,1,1,WARN,_cVar11,(size_t)&local_248,0x3a9);
          boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
        }
      }
      else {
        pUVar4 = ::UniValue::operator[](pUVar3,index);
        psVar5 = ::UniValue::get_str_abi_cxx11_(pUVar4);
        pcVar1 = (psVar5->_M_dataplus)._M_p;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar1,pcVar1 + psVar5->_M_string_length);
        ::ParseScript((CScript *)&local_f0.indirect_contents,&local_d0);
        pUVar4 = ::UniValue::operator[](pUVar3,(ulong)(iVar2 + 1));
        psVar5 = ::UniValue::get_str_abi_cxx11_(pUVar4);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        pcVar1 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar1,pcVar1 + psVar5->_M_string_length);
        ::ParseScript((CScript *)&local_130.indirect_contents,&local_110);
        pUVar4 = ::UniValue::operator[](pUVar3,(ulong)(iVar2 + 2));
        psVar5 = ::UniValue::get_str_abi_cxx11_(pUVar4);
        local_150[0] = local_140;
        pcVar1 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_150,pcVar1,pcVar1 + psVar5->_M_string_length);
        strFlags._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffd8c;
        strFlags._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffd88;
        strFlags._M_string_length = (size_type)_cVar11;
        strFlags.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
        strFlags.field_2._8_8_ = (undefined8)_cVar10;
        uVar8 = ParseScriptFlags(strFlags);
        if (local_150[0] != local_140) {
          operator_delete(local_150[0],local_140[0] + 1);
        }
        in_stack_fffffffffffffd88 = iVar2 + 3;
        pUVar3 = ::UniValue::operator[](pUVar3,(ulong)in_stack_fffffffffffffd88);
        psVar5 = ::UniValue::get_str_abi_cxx11_(pUVar3);
        lVar6 = 8;
        bVar9 = false;
        do {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(psVar5,*(char **)((long)&script_errors[0].err + lVar6));
          if (iVar2 == 0) {
            in_stack_fffffffffffffd88 = *(uint *)(&UNK_013afb28 + lVar6);
            break;
          }
          lVar6 = lVar6 + 0x10;
          bVar9 = lVar6 == 0x2b8;
        } while (!bVar9);
        if (bVar9) {
          local_160 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_158 = "";
          local_170 = &boost::unit_test::basic_cstring<char_const>::null;
          local_168 = &boost::unit_test::basic_cstring<char_const>::null;
          file_00.m_end = (iterator)0x6f;
          file_00.m_begin = (iterator)&local_160;
          msg_00.m_end = (iterator)in_R9;
          msg_00.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                     (size_t)&local_170,msg_00);
          local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x0;
          local_188.m_message.px = (element_type *)0x0;
          local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_1e8.m_message.px =
               (element_type *)((ulong)local_1e8.m_message.px & 0xffffffffffffff00);
          local_1e8._0_8_ = &PTR__lazy_ostream_013ad1c0;
          local_1e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_1d0 = "Unknown scripterror \"";
          local_1c0 = 0;
          local_1c8 = &PTR__lazy_ostream_013afe70;
          local_1b8 = (undefined ***)&local_1e8;
          local_1a8.m_empty = false;
          local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013afe30;
          local_198 = &local_1c8;
          local_190 = "\" in test description";
          local_1f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_1f0 = "";
          in_stack_fffffffffffffd8c = 0;
          local_1b0 = psVar5;
          boost::test_tools::tt_detail::report_assertion
                    (&local_188,&local_1a8,1,1,WARN,_cVar11,(size_t)&local_1f8,0x6f);
          boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
          in_stack_fffffffffffffd88 = 1;
        }
        _cVar11 = _cVar10;
        in_R8 = (iterator)(ulong)uVar8;
        in_R9 = (string *)local_b0;
        ScriptTest::DoTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,
                           (CScript *)&local_130.indirect_contents,
                           (CScript *)&local_f0.indirect_contents,&local_218,uVar8,in_R9,
                           in_stack_fffffffffffffd88,(CAmount)_cVar11);
        if (0x1c < local_114) {
          free(local_130.indirect_contents.indirect);
          local_130.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (0x1c < local_d4) {
          free(local_f0.indirect_contents.indirect);
          local_f0.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&local_218.stack);
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      index_00 = (size_t)((int)index_00 + 1);
      uVar7 = ((long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    } while (index_00 <= uVar7 && uVar7 - index_00 != 0);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,local_90.val.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_json_test)
{
    // Read tests from test/data/script_tests.json
    // Format is an array of arrays
    // Inner arrays are [ ["wit"..., nValue]?, "scriptSig", "scriptPubKey", "flags", "expected_scripterror" ]
    // ... where scriptSig and scriptPubKey are stringified
    // scripts.
    // If a witness is given, then the last value in the array should be the
    // amount (nValue) to use in the crediting tx
    UniValue tests = read_json(json_tests::script_tests);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        CScriptWitness witness;
        CAmount nValue = 0;
        unsigned int pos = 0;
        if (test.size() > 0 && test[pos].isArray()) {
            unsigned int i=0;
            for (i = 0; i < test[pos].size()-1; i++) {
                witness.stack.push_back(ParseHex(test[pos][i].get_str()));
            }
            nValue = AmountFromValue(test[pos][i]);
            pos++;
        }
        if (test.size() < 4 + pos) // Allow size > 3; extra stuff ignored (useful for comments)
        {
            if (test.size() != 1) {
                BOOST_ERROR("Bad test: " << strTest);
            }
            continue;
        }
        std::string scriptSigString = test[pos++].get_str();
        CScript scriptSig = ParseScript(scriptSigString);
        std::string scriptPubKeyString = test[pos++].get_str();
        CScript scriptPubKey = ParseScript(scriptPubKeyString);
        unsigned int scriptflags = ParseScriptFlags(test[pos++].get_str());
        int scriptError = ParseScriptError(test[pos++].get_str());

        DoTest(scriptPubKey, scriptSig, witness, scriptflags, strTest, scriptError, nValue);
    }
}